

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O1

uchar IDisk::ConvertMFMToByte(uchar *pattern)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  
  bVar2 = 7;
  uVar3 = 0xffffffffffffffff;
  bVar1 = 0;
  do {
    bVar1 = bVar1 | (byte)((pattern[uVar3 + 2] & 1) << (bVar2 & 0x1f));
    bVar2 = bVar2 - 1;
    uVar3 = uVar3 + 2;
  } while (uVar3 < 0xe);
  return bVar1;
}

Assistant:

unsigned char IDisk::ConvertMFMToByte(const unsigned char pattern[16])
{
   unsigned char b = 0;
   auto dec = 7;
   for (auto i = 1; i < 16; i += 2)
   {
      if (i > 2 &&
         (
            (pattern[i - 1] == 1 && pattern[i - 2] == 1)
            || (pattern[i - 1] == 1 && pattern[i] == 1)
            || (pattern[i - 1] == 0 && pattern[i - 2] == 0 && pattern[i] == 0)
         )
      )
      {
      }
      b |= ((pattern[i] & 1) << dec);
      dec--;
   }
   return b;
}